

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_result.cpp
# Opt level: O3

void __thiscall
duckdb::BaseQueryResult::BaseQueryResult
          (BaseQueryResult *this,QueryResultType type,ErrorData *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ExceptionType EVar7;
  
  this->_vptr_BaseQueryResult = (_func_int **)&PTR__BaseQueryResult_0246c5c0;
  this->type = type;
  (this->properties).read_databases._M_h._M_buckets =
       &(this->properties).read_databases._M_h._M_single_bucket;
  (this->properties).read_databases._M_h._M_bucket_count = 1;
  (this->properties).read_databases._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->properties).read_databases._M_h._M_element_count = 0;
  (this->properties).read_databases._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->properties).read_databases._M_h._M_rehash_policy._M_next_resize = 0;
  (this->properties).read_databases._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->properties).modified_databases._M_h._M_buckets =
       &(this->properties).modified_databases._M_h._M_single_bucket;
  (this->properties).modified_databases._M_h._M_bucket_count = 1;
  (this->properties).modified_databases._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->properties).modified_databases._M_h._M_element_count = 0;
  (this->properties).modified_databases._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->properties).modified_databases._M_h._M_rehash_policy._M_next_resize = 0;
  (this->properties).modified_databases._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->properties).requires_valid_transaction = true;
  (this->properties).allow_stream_result = false;
  (this->properties).bound_all_parameters = true;
  (this->properties).return_type = QUERY_RESULT;
  (this->properties).parameter_count = 0;
  (this->properties).always_require_rebind = false;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->success = false;
  EVar7 = error->type;
  (this->error).initialized = error->initialized;
  (this->error).type = EVar7;
  paVar2 = &(this->error).raw_message.field_2;
  (this->error).raw_message._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (error->raw_message)._M_dataplus._M_p;
  paVar1 = &(error->raw_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined4 *)((long)&(error->raw_message).field_2 + 4);
    uVar5 = *(undefined4 *)((long)&(error->raw_message).field_2 + 8);
    uVar6 = *(undefined4 *)((long)&(error->raw_message).field_2 + 0xc);
    *(undefined4 *)paVar2 = *(undefined4 *)paVar1;
    *(undefined4 *)((long)&(this->error).raw_message.field_2 + 4) = uVar4;
    *(undefined4 *)((long)&(this->error).raw_message.field_2 + 8) = uVar5;
    *(undefined4 *)((long)&(this->error).raw_message.field_2 + 0xc) = uVar6;
  }
  else {
    (this->error).raw_message._M_dataplus._M_p = pcVar3;
    (this->error).raw_message.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->error).raw_message._M_string_length = (error->raw_message)._M_string_length;
  (error->raw_message)._M_dataplus._M_p = (pointer)paVar1;
  (error->raw_message)._M_string_length = 0;
  (error->raw_message).field_2._M_local_buf[0] = '\0';
  paVar2 = &(this->error).final_message.field_2;
  (this->error).final_message._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (error->final_message)._M_dataplus._M_p;
  paVar1 = &(error->final_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined4 *)((long)&(error->final_message).field_2 + 4);
    uVar5 = *(undefined4 *)((long)&(error->final_message).field_2 + 8);
    uVar6 = *(undefined4 *)((long)&(error->final_message).field_2 + 0xc);
    *(undefined4 *)paVar2 = *(undefined4 *)paVar1;
    *(undefined4 *)((long)&(this->error).final_message.field_2 + 4) = uVar4;
    *(undefined4 *)((long)&(this->error).final_message.field_2 + 8) = uVar5;
    *(undefined4 *)((long)&(this->error).final_message.field_2 + 0xc) = uVar6;
  }
  else {
    (this->error).final_message._M_dataplus._M_p = pcVar3;
    (this->error).final_message.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->error).final_message._M_string_length = (error->final_message)._M_string_length;
  (error->final_message)._M_dataplus._M_p = (pointer)paVar1;
  (error->final_message)._M_string_length = 0;
  (error->final_message).field_2._M_local_buf[0] = '\0';
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&(this->error).extra_info,&error->extra_info);
  return;
}

Assistant:

BaseQueryResult::BaseQueryResult(QueryResultType type, ErrorData error)
    : type(type), success(false), error(std::move(error)) {
	// Assert that the error object is initialized
	D_ASSERT(this->error.HasError());
}